

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph-opt.cpp
# Opt level: O2

ParseResult * parseArgs(ParseResult *__return_storage_ptr__,Options *Opts,int *argc,char **argv)

{
  ostream *poVar1;
  char **argv_local;
  
  argv_local = argv;
  if (1 < *argc) {
    cxxopts::Options::parse(__return_storage_ptr__,Opts,argc,&argv_local);
    return __return_storage_ptr__;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"ph-opt");
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = std::operator<<(poVar1,"\x1b[31m error: \x1b[0m");
  std::operator<<(poVar1,"no input files! Usage see option \'--help\'.\n");
  exit(-1);
}

Assistant:

ParseResult parseArgs(Options &Opts, int &argc, char **argv) {
  if (argc < 2) {
    std::cerr << PH_OPTIMIZER_EXE << ":" << FRED(" error: ")
              << "no input files! Usage see option '--help'.\n";
    exit(-1);
  }
  try {
    auto Result = Opts.parse(argc, argv);
    return Result;
  } catch (const cxxopts::OptionException &E) {
    // FIXME: wrong cli options CANNOT be detected now.
    std::cerr << PH_OPTIMIZER_EXE << ":" << FRED(" error: ")
              << "parsing options: " << E.what() << std::endl;
    exit(-1);
  }
}